

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# int_helper.c
# Opt level: O2

void helper_divq_EAX_x86_64(CPUX86State *env,target_ulong t0)

{
  int iVar1;
  uint64_t r1;
  uint64_t r0;
  target_ulong local_18;
  target_ulong local_10;
  
  if (t0 != 0) {
    local_10 = env->regs[0];
    local_18 = env->regs[2];
    iVar1 = div64(&local_10,&local_18,t0);
    if (iVar1 == 0) {
      env->regs[0] = local_10;
      env->regs[2] = local_18;
      return;
    }
  }
  raise_exception_ra_x86_64(env,0,r1);
}

Assistant:

void helper_divq_EAX(CPUX86State *env, target_ulong t0)
{
    uint64_t r0, r1;

    if (t0 == 0) {
        raise_exception_ra(env, EXCP00_DIVZ, GETPC());
    }
    r0 = env->regs[R_EAX];
    r1 = env->regs[R_EDX];
    if (div64(&r0, &r1, t0)) {
        raise_exception_ra(env, EXCP00_DIVZ, GETPC());
    }
    env->regs[R_EAX] = r0;
    env->regs[R_EDX] = r1;
}